

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * slang::ast::PackedUnionType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  bool *pbVar1;
  TokenKind TVar2;
  size_t sVar3;
  SyntaxNode *syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  StructUnionMemberSyntax *pSVar5;
  Compilation *this;
  bool bVar6;
  bitwidth_t bVar7;
  bitwidth_t bVar8;
  PackedUnionType *type;
  Type *pTVar9;
  ulong uVar10;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar11;
  FieldSymbol *this_00;
  Diagnostic *pDVar12;
  SourceLocation SVar13;
  reference pvVar14;
  Type *pTVar15;
  uint uVar16;
  pointer ppSVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  SourceRange SVar21;
  string_view sVar22;
  bool isTagged;
  bool isSoft;
  bool isSigned;
  Token name;
  ASTContext context;
  bool local_101;
  uint local_100;
  bool local_fa;
  bool local_f9;
  Type *local_f8;
  StructUnionMemberSyntax *local_f0;
  Compilation *local_e8;
  uint local_e0 [2];
  Token local_d8;
  PackedUnionType *local_c0;
  Scope *local_b8;
  string_view local_b0;
  StructUnionTypeSyntax *local_a0;
  pointer local_98;
  pointer local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  SourceLocation local_70;
  ASTContext local_68;
  
  local_f9 = (syntax->signing).kind == SignedKeyword;
  TVar2 = (syntax->taggedOrSoft).kind;
  local_101 = TVar2 == TaggedKeyword;
  local_fa = TVar2 == SoftKeyword;
  local_68.scope.ptr = (Scope *)parsing::Token::location(&syntax->keyword);
  local_e8 = comp;
  type = BumpAllocator::
         emplace<slang::ast::PackedUnionType,slang::ast::Compilation&,bool_const&,bool_const&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                   (&comp->super_BumpAllocator,comp,&local_f9,&local_101,&local_fa,
                    (SourceLocation *)&local_68,parentContext);
  (type->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_b8 = &type->super_Scope;
  local_68.flags.m_bits = (parentContext->flags).m_bits;
  local_68.lookupIndex = 0xffffffff;
  local_68.instanceOrProc = (Symbol *)0x0;
  local_68.firstTempVar = (TempVarSymbol *)0x0;
  local_68.randomizeDetails = (RandomizeDetails *)0x0;
  local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
  sVar3 = (syntax->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  uVar20 = 0;
  local_68.scope.ptr = local_b8;
  if (sVar3 == 0) {
    local_100 = 0;
  }
  else {
    ppSVar17 = (syntax->members).
               super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    local_98 = ppSVar17 + sVar3;
    local_100 = 0;
    local_c0 = type;
    local_a0 = syntax;
    do {
      local_f0 = *ppSVar17;
      syntax_00 = (local_f0->super_SyntaxNode).previewNode;
      local_90 = ppSVar17;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_b8,syntax_00);
      }
      pTVar9 = Compilation::getType(local_e8,(local_f0->type).ptr,&local_68,(Type *)0x0);
      bVar6 = Type::isFourState(pTVar9);
      pbVar1 = &(type->super_IntegralType).isFourState;
      *pbVar1 = (bool)(*pbVar1 | bVar6);
      pTVar15 = pTVar9->canonical;
      local_f8 = pTVar9;
      if (pTVar15 == (Type *)0x0) {
        Type::resolveCanonical(pTVar9);
        pTVar15 = pTVar9->canonical;
      }
      uVar16 = local_100 & 1;
      local_100 = (uint)CONCAT71((int7)((ulong)pTVar15 >> 8),1);
      if (uVar16 == 0 && (pTVar15->super_Symbol).kind != ErrorType) {
        bVar6 = Type::isIntegral(local_f8);
        pTVar15 = local_f8;
        if (bVar6) {
LAB_0029f282:
          local_100 = 0;
        }
        else {
          if (local_101 == true) {
            pTVar9 = local_f8->canonical;
            if (pTVar9 == (Type *)0x0) {
              Type::resolveCanonical(local_f8);
              pTVar9 = pTVar15->canonical;
            }
            if ((pTVar9->super_Symbol).kind == VoidType) goto LAB_0029f282;
          }
          pSVar5 = local_f0;
          local_d8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(local_f0->type).ptr);
          SVar13 = parsing::Token::location(&local_d8);
          pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1c0009,SVar13);
          ast::operator<<(pDVar12,local_f8);
          SVar21 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(pSVar5->type).ptr);
          type = local_c0;
          Diagnostic::operator<<(pDVar12,SVar21);
        }
      }
      uVar10 = (local_f0->declarators).elements._M_extent._M_extent_value + 1;
      if (1 < uVar10) {
        uVar10 = uVar10 >> 1;
        lVar18 = 0;
        do {
          pSVar5 = local_f0;
          local_88 = lVar18;
          local_80 = uVar10;
          ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((long)&(((local_f0->declarators).elements._M_ptr)->
                                         super_ConstTokenOrSyntax).
                                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                 + lVar18));
          pSVar4 = *ppSVar11;
          local_d8 = *(Token *)(pSVar4 + 1);
          local_b0 = parsing::Token::valueText(&local_d8);
          local_70 = parsing::Token::location(&local_d8);
          this = local_e8;
          local_e0[1] = 0;
          local_e0[0] = (uint)uVar20;
          local_78 = uVar20;
          this_00 = BumpAllocator::
                    emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                              (&local_e8->super_BumpAllocator,&local_b0,&local_70,local_e0 + 1,
                               local_e0);
          pTVar15 = local_f8;
          (this_00->super_VariableSymbol).super_ValueSymbol.declaredType.type = local_f8;
          (this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar4;
          syntax_01._M_ptr =
               (pSVar5->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (pSVar5->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)this_00,local_68.scope.ptr,syntax_01);
          Scope::insertMember(local_b8,(Symbol *)this_00,(type->super_Scope).lastMember,false,true);
          pTVar15 = Compilation::getType
                              (this,pTVar15,
                               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                               &pSVar4[1].previewNode,&local_68);
          bVar6 = Type::isUnpackedArray(pTVar15);
          if ((bVar6) && ((local_100 & 1) == 0)) {
            SVar21 = parsing::Token::range((Token *)(pSVar4 + 1));
            pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1c0009,SVar21);
            ast::operator<<(pDVar12,pTVar15);
            SVar21 = slang::syntax::SyntaxNode::sourceRange(pSVar4 + 2);
            pDVar12 = Diagnostic::operator<<(pDVar12,SVar21);
            local_100 = (uint)CONCAT71((int7)((ulong)pDVar12 >> 8),1);
          }
          uVar20 = local_78;
          type = local_c0;
          bVar8 = (local_c0->super_IntegralType).bitWidth;
          if (bVar8 == 0) {
            bVar8 = Type::getBitWidth(local_f8);
LAB_0029f4e3:
            (type->super_IntegralType).bitWidth = bVar8;
          }
          else {
            if ((local_101 != false) || (local_fa == true)) {
              bVar8 = Type::getBitWidth(local_f8);
              uVar16 = (type->super_IntegralType).bitWidth;
              if (bVar8 < uVar16) {
                bVar8 = uVar16;
              }
              goto LAB_0029f4e3;
            }
            bVar7 = Type::getBitWidth(local_f8);
            if (((bVar8 != bVar7) && ((local_100 & 1) == 0)) &&
               (sVar22 = parsing::Token::valueText(&local_d8), sVar22._M_len != 0)) {
              SVar21 = parsing::Token::range(&local_d8);
              pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1e0009,SVar21);
              sVar22 = parsing::Token::valueText(&local_d8);
              pDVar12 = Diagnostic::operator<<(pDVar12,sVar22);
              bVar8 = Type::getBitWidth(local_f8);
              local_b0._M_len = (ulong)bVar8;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&pDVar12->args,&local_b0._M_len);
              local_b0._M_len = (ulong)(type->super_IntegralType).bitWidth;
              pvVar14 = std::
                        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        ::emplace_back<unsigned_long>(&pDVar12->args,&local_b0._M_len);
              local_100 = (uint)CONCAT71((int7)((ulong)pvVar14 >> 8),1);
            }
          }
          if (*(long *)(pSVar4 + 4) != 0) {
            SVar13 = parsing::Token::location((Token *)(*(long *)(pSVar4 + 4) + 0x18));
            pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1b0009,SVar13);
            SVar21 = slang::syntax::SyntaxNode::sourceRange
                               (*(SyntaxNode **)(*(long *)(pSVar4 + 4) + 0x28));
            Diagnostic::operator<<(pDVar12,SVar21);
          }
          lVar18 = local_88 + 0x30;
          uVar20 = (ulong)((int)uVar20 + 1);
          uVar10 = local_80 - 1;
        } while (uVar10 != 0);
      }
      ppSVar17 = local_90 + 1;
    } while (ppSVar17 != local_98);
    syntax = local_a0;
    if ((local_101 & (int)uVar20 != 0) != 0) {
      uVar16 = 0x20;
      uVar19 = (int)uVar20 - 1;
      if (uVar19 != 0) {
        uVar16 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        uVar16 = uVar16 ^ 0x1f;
      }
      type->tagBits = 0x20 - uVar16;
      bVar8 = (0x20 - uVar16) + (type->super_IntegralType).bitWidth;
      (type->super_IntegralType).bitWidth = bVar8;
      goto LAB_0029f637;
    }
  }
  bVar8 = (type->super_IntegralType).bitWidth;
LAB_0029f637:
  if ((bVar8 == 0) || ((local_100 & 1) != 0)) {
    pTVar15 = local_e8->errorType;
  }
  else {
    pTVar15 = anon_unknown.dwarf_b2a841::createPackedDims
                        (&local_68,(Type *)type,&syntax->dimensions);
  }
  return pTVar15;
}

Assistant:

const Type& PackedUnionType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                        const ASTContext& parentContext) {
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    const bool isTagged = syntax.taggedOrSoft.kind == TokenKind::TaggedKeyword;
    const bool isSoft = syntax.taggedOrSoft.kind == TokenKind::SoftKeyword;
    bool issuedError = false;
    uint32_t fieldIndex = 0;

    auto unionType = comp.emplace<PackedUnionType>(comp, isSigned, isTagged, isSoft,
                                                   syntax.keyword.location(), parentContext);
    unionType->setSyntax(syntax);

    ASTContext context(*unionType, LookupLocation::max, parentContext.flags);

    for (auto member : syntax.members) {
        if (member->previewNode)
            unionType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        unionType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral() && (!isTagged || !type.isVoid())) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto name = decl->name;
            auto field = comp.emplace<FieldSymbol>(name.valueText(), name.location(), 0u,
                                                   fieldIndex++);
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            unionType->addMember(*field);

            // Unpacked arrays are disallowed in packed unions.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            if (!unionType->bitWidth) {
                unionType->bitWidth = type.getBitWidth();
            }
            else if (isTagged || isSoft) {
                // In tagged unions the members don't all have to have the same width.
                unionType->bitWidth = std::max(unionType->bitWidth, type.getBitWidth());
            }
            else if (unionType->bitWidth != type.getBitWidth() && !issuedError &&
                     !name.valueText().empty()) {
                auto& diag = context.addDiag(diag::PackedUnionWidthMismatch, name.range());
                diag << name.valueText() << type.getBitWidth() << unionType->bitWidth;
                issuedError = true;
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    // In tagged unions the tag contributes to the total number of packed bits.
    if (isTagged && fieldIndex) {
        unionType->tagBits = (uint32_t)std::bit_width(fieldIndex - 1);
        unionType->bitWidth += unionType->tagBits;
    }

    if (!unionType->bitWidth || issuedError)
        return comp.getErrorType();

    return createPackedDims(context, unionType, syntax.dimensions);
}